

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fastq_parser_test.cpp
# Opt level: O1

void __thiscall bioparser::test::BioparserFastqTest::Check(BioparserFastqTest *this)

{
  undefined8 *puVar1;
  pointer puVar2;
  char *pcVar3;
  AssertionResult gtest_ar;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_30;
  AssertHelper local_28;
  internal local_20 [8];
  undefined8 *local_18;
  
  local_28.data_._0_4_ = 0xd;
  local_30._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((long)(this->s).
              super__Vector_base<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)(this->s).
              super__Vector_base<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start >> 3);
  testing::internal::CmpHelperEQ<int,unsigned_long>
            (local_20,"13","s.size()",(int *)&local_28,(unsigned_long *)&local_30);
  if (local_20[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_30);
    if (local_18 == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (char *)*local_18;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/rvaser[P]bioparser/test/fastq_parser_test.cpp"
               ,0x16,pcVar3);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if (local_30._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_30._M_head_impl + 8))();
    }
  }
  puVar1 = local_18;
  if (local_18 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_18 != local_18 + 2) {
      operator_delete((undefined8 *)*local_18);
    }
    operator_delete(puVar1);
  }
  local_30._M_head_impl._0_4_ = 0x11;
  local_28.data_._0_4_ = 0;
  for (puVar2 = (this->s).
                super__Vector_base<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      puVar2 != (this->s).
                super__Vector_base<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; puVar2 = puVar2 + 1) {
    local_28.data_._0_4_ =
         (int)local_28.data_ +
         (int)(((puVar2->_M_t).
                super___uniq_ptr_impl<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>.
                _M_t.
                super__Tuple_impl<0UL,_biosoup::Sequence_*,_std::default_delete<biosoup::Sequence>_>
                .super__Head_base<0UL,_biosoup::Sequence_*,_false>._M_head_impl)->name).
              _M_string_length;
  }
  testing::internal::CmpHelperEQ<int,int>
            (local_20,"17",
             "std::accumulate(s.begin(), s.end(), 0, [] (std::uint32_t s, const std::unique_ptr<biosoup::Sequence>& it) { return s + it->name.size(); })"
             ,(int *)&local_30,(int *)&local_28);
  if (local_20[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_30);
    if (local_18 == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (char *)*local_18;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/rvaser[P]bioparser/test/fastq_parser_test.cpp"
               ,0x1a,pcVar3);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if (local_30._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_30._M_head_impl + 8))();
    }
  }
  puVar1 = local_18;
  if (local_18 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_18 != local_18 + 2) {
      operator_delete((undefined8 *)*local_18);
    }
    operator_delete(puVar1);
  }
  local_30._M_head_impl._0_4_ = 0x1a66c;
  local_28.data_._0_4_ = 0;
  for (puVar2 = (this->s).
                super__Vector_base<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      puVar2 != (this->s).
                super__Vector_base<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; puVar2 = puVar2 + 1) {
    local_28.data_._0_4_ =
         (int)local_28.data_ +
         (int)(((puVar2->_M_t).
                super___uniq_ptr_impl<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>.
                _M_t.
                super__Tuple_impl<0UL,_biosoup::Sequence_*,_std::default_delete<biosoup::Sequence>_>
                .super__Head_base<0UL,_biosoup::Sequence_*,_false>._M_head_impl)->data).
              _M_string_length;
  }
  testing::internal::CmpHelperEQ<int,int>
            (local_20,"108140",
             "std::accumulate(s.begin(), s.end(), 0, [] (std::uint32_t s, const std::unique_ptr<biosoup::Sequence>& it) { return s + it->data.size(); })"
             ,(int *)&local_30,(int *)&local_28);
  if (local_20[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_30);
    if (local_18 == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (char *)*local_18;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/rvaser[P]bioparser/test/fastq_parser_test.cpp"
               ,0x1e,pcVar3);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if (local_30._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_30._M_head_impl + 8))();
    }
  }
  puVar1 = local_18;
  if (local_18 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_18 != local_18 + 2) {
      operator_delete((undefined8 *)*local_18);
    }
    operator_delete(puVar1);
  }
  local_30._M_head_impl._0_4_ = 0x1a66c;
  local_28.data_._0_4_ = 0;
  for (puVar2 = (this->s).
                super__Vector_base<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      puVar2 != (this->s).
                super__Vector_base<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>,_std::allocator<std::unique_ptr<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; puVar2 = puVar2 + 1) {
    local_28.data_._0_4_ =
         (int)local_28.data_ +
         (int)(((puVar2->_M_t).
                super___uniq_ptr_impl<biosoup::Sequence,_std::default_delete<biosoup::Sequence>_>.
                _M_t.
                super__Tuple_impl<0UL,_biosoup::Sequence_*,_std::default_delete<biosoup::Sequence>_>
                .super__Head_base<0UL,_biosoup::Sequence_*,_false>._M_head_impl)->quality).
              _M_string_length;
  }
  testing::internal::CmpHelperEQ<int,int>
            (local_20,"108140",
             "std::accumulate(s.begin(), s.end(), 0, [] (std::uint32_t s, const std::unique_ptr<biosoup::Sequence>& it) { return s + it->quality.size(); })"
             ,(int *)&local_30,(int *)&local_28);
  if (local_20[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_30);
    if (local_18 == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (char *)*local_18;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/rvaser[P]bioparser/test/fastq_parser_test.cpp"
               ,0x22,pcVar3);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if (local_30._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_30._M_head_impl + 8))();
    }
  }
  if (local_18 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_18 != local_18 + 2) {
      operator_delete((undefined8 *)*local_18);
    }
    operator_delete(local_18);
  }
  return;
}

Assistant:

void Check() {
    EXPECT_EQ(13, s.size());
    EXPECT_EQ(17, std::accumulate(s.begin(), s.end(), 0,
        [] (std::uint32_t s, const std::unique_ptr<biosoup::Sequence>& it) {
          return s + it->name.size();
        }));
    EXPECT_EQ(108140, std::accumulate(s.begin(), s.end(), 0,
        [] (std::uint32_t s, const std::unique_ptr<biosoup::Sequence>& it) {
          return s + it->data.size();
        }));
    EXPECT_EQ(108140, std::accumulate(s.begin(), s.end(), 0,
        [] (std::uint32_t s, const std::unique_ptr<biosoup::Sequence>& it) {
          return s + it->quality.size();
        }));
  }